

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

TemporaryCompressionLevel __thiscall
duckdb::TemporaryFileCompressionAdaptivity::GetCompressionLevel
          (TemporaryFileCompressionAdaptivity *this)

{
  TemporaryCompressionLevel TVar1;
  long lVar2;
  int iVar3;
  TemporaryCompressionLevel TVar4;
  idx_t compression_idx;
  unsigned_long uVar5;
  unsigned_long uVar6;
  int64_t iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  iVar7 = this->last_compressed_writes_ns[0];
  uVar5 = 1;
  uVar6 = 0;
  do {
    if (this->last_compressed_writes_ns[uVar5] < iVar7) {
      uVar6 = uVar5;
      iVar7 = this->last_compressed_writes_ns[uVar5];
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 6);
  iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(uVar6);
  lVar2 = this->last_uncompressed_write_ns;
  dVar8 = RandomEngine::NextRandom(&this->random_engine);
  dVar9 = RandomEngine::NextRandom(&this->random_engine);
  TVar1 = iVar3 * 2 + ZSTD_MINUS_FIVE;
  dVar10 = (double)iVar7 / (double)lVar2;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (0.5 <= dVar8) {
    if (dVar10 < 2.0) {
      return TVar1;
    }
    return UNCOMPRESSED;
  }
  TVar4 = (uint)(dVar10 < 2.0) * 5 + ZSTD_MINUS_FIVE;
  if (2.0 <= dVar10) {
    return TVar4;
  }
  if (dVar9 < 0.5) {
    return TVar4;
  }
  if (TVar1 != ZSTD_FIVE) {
    if (dVar10 < 1.0) {
      uVar6 = uVar6 + 1;
      goto LAB_0114719d;
    }
    if (iVar3 == 0) {
      return UNCOMPRESSED;
    }
  }
  uVar6 = uVar6 - 1;
LAB_0114719d:
  iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(uVar6);
  return iVar3 * 2 + ZSTD_MINUS_FIVE;
}

Assistant:

TemporaryCompressionLevel TemporaryFileCompressionAdaptivity::GetCompressionLevel() {
	idx_t min_compression_idx = 0;
	TemporaryCompressionLevel level;

	double ratio;
	bool should_compress;

	bool should_deviate;
	bool deviate_uncompressed;
	{
		lock_guard<mutex> guard(random_engine.lock);

		auto min_compressed_time = last_compressed_writes_ns[min_compression_idx];
		for (idx_t compression_idx = 1; compression_idx < LEVELS; compression_idx++) {
			const auto time = last_compressed_writes_ns[compression_idx];
			if (time < min_compressed_time) {
				min_compression_idx = compression_idx;
				min_compressed_time = time;
			}
		}
		level = IndexToLevel(min_compression_idx);

		ratio = static_cast<double>(min_compressed_time) / static_cast<double>(last_uncompressed_write_ns);
		should_compress = ratio < DURATION_RATIO_THRESHOLD;

		should_deviate = random_engine.NextRandom() < COMPRESSION_DEVIATION;
		deviate_uncompressed = random_engine.NextRandom() < 0.5; // Coin flip to deviate with just uncompressed
	}

	TemporaryCompressionLevel result;
	if (!should_deviate) {
		result = should_compress ? level : TemporaryCompressionLevel::UNCOMPRESSED; // Don't deviate
	} else if (!should_compress) {
		result = MinimumCompressionLevel(); // Deviate from uncompressed -> go to fastest level
	} else if (deviate_uncompressed) {
		result = TemporaryCompressionLevel::UNCOMPRESSED;
	} else if (level == MaximumCompressionLevel()) {
		result = IndexToLevel(min_compression_idx - 1); // At highest level, go down one
	} else if (ratio < 1.0) { // Compressed writes are faster, try increasing the compression level
		result = IndexToLevel(min_compression_idx + 1);
	} else { // Compressed writes are slower, try decreasing the compression level
		result = level == MinimumCompressionLevel()
		             ? TemporaryCompressionLevel::UNCOMPRESSED // Already lowest level, go to uncompressed
		             : IndexToLevel(min_compression_idx - 1);
	}
	return result;
}